

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O3

int pt_encode_mode_tsx(pt_encoder *encoder,uint8_t bits)

{
  int iVar1;
  pt_packet packet;
  pt_packet local_18;
  
  local_18.type = ppt_mode;
  local_18.payload.ip.ipc = 0x20;
  local_18.payload.cfe.vector = -(bits & 1) & 0xfd | bits & 2;
  iVar1 = pt_enc_next(encoder,&local_18);
  return iVar1;
}

Assistant:

int pt_encode_mode_tsx(struct pt_encoder *encoder, uint8_t bits)
{
	struct pt_packet packet;

	packet.type = ppt_mode;
	packet.payload.mode.leaf = pt_mol_tsx;

	if (bits & pt_mob_tsx_intx)
		packet.payload.mode.bits.tsx.intx = 1;
	else
		packet.payload.mode.bits.tsx.intx = 0;

	if (bits & pt_mob_tsx_abrt)
		packet.payload.mode.bits.tsx.abrt = 1;
	else
		packet.payload.mode.bits.tsx.abrt = 0;

	return pt_enc_next(encoder, &packet);
}